

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::RemoveADirectory(string *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  char *pcVar6;
  ulong dindex;
  Directory dir;
  string fullPath;
  stat st;
  Directory DStack_e8;
  string local_e0;
  stat64 local_c0;
  
  iVar4 = stat64((source->_M_dataplus)._M_p,&local_c0);
  if (-1 < iVar4) {
    SetPermissions(source,local_c0.st_mode | 0x80);
  }
  Directory::Directory(&DStack_e8);
  Directory::Load(&DStack_e8,source);
  paVar1 = &local_e0.field_2;
  dindex = 0;
  do {
    uVar5 = Directory::GetNumberOfFiles(&DStack_e8);
    if (uVar5 <= dindex) {
      iVar4 = rmdir((source->_M_dataplus)._M_p);
      bVar3 = iVar4 == 0;
LAB_00146f5e:
      Directory::~Directory(&DStack_e8);
      return bVar3;
    }
    pcVar6 = Directory::GetFile(&DStack_e8,dindex);
    if ((*pcVar6 != '.') || (pcVar6[1] != '\0')) {
      pcVar6 = Directory::GetFile(&DStack_e8,dindex);
      if ((*pcVar6 != '.') || ((pcVar6[1] != '.' || (pcVar6[2] != '\0')))) {
        pcVar2 = (source->_M_dataplus)._M_p;
        local_e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar2,pcVar2 + source->_M_string_length);
        std::__cxx11::string::append((char *)&local_e0);
        Directory::GetFile(&DStack_e8,dindex);
        std::__cxx11::string::append((char *)&local_e0);
        bVar3 = FileIsDirectory(&local_e0);
        if (bVar3) {
          iVar4 = lstat64(local_e0._M_dataplus._M_p,&local_c0);
          if ((iVar4 == 0) && ((local_c0.st_mode & 0xf000) == 0xa000)) goto LAB_00146f01;
          bVar3 = RemoveADirectory(&local_e0);
        }
        else {
LAB_00146f01:
          bVar3 = RemoveFile(&local_e0);
        }
        if (bVar3 == false) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = false;
          goto LAB_00146f5e;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    dindex = dindex + 1;
  } while( true );
}

Assistant:

bool SystemTools::RemoveADirectory(const kwsys_stl::string& source)
{
  // Add write permission to the directory so we can modify its
  // content to remove files and directories from it.
  mode_t mode;
  if(SystemTools::GetPermissions(source, mode))
    {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IWRITE;
#else
    mode |= S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
    }

  Directory dir;
#ifdef _WIN32
  dir.Load(Encoding::ToNarrow(
             SystemTools::ConvertToWindowsExtendedPath(source)));
#else
  dir.Load(source);
#endif
  size_t fileNum;
  for (fileNum = 0; fileNum <  dir.GetNumberOfFiles(); ++fileNum)
    {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".."))
      {
      kwsys_stl::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if(SystemTools::FileIsDirectory(fullPath) &&
        !SystemTools::FileIsSymlink(fullPath))
        {
        if (!SystemTools::RemoveADirectory(fullPath))
          {
          return false;
          }
        }
      else
        {
        if(!SystemTools::RemoveFile(fullPath))
          {
          return false;
          }
        }
      }
    }

  return (Rmdir(source) == 0);
}